

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat m;
  Mat local_58;
  
  (**this->_vptr_ModelBin)(&local_58,this,(ulong)(uint)(h * w * c),(ulong)(uint)type);
  if ((local_58.data == (void *)0x0) || ((long)local_58.c * local_58.cstep == 0)) {
    Mat::Mat(__return_storage_ptr__,&local_58);
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_58,w,h,c);
  }
  Mat::~Mat(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}